

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void LowererMD::LowerInt4NegWithBailOut
               (Instr *instr,BailOutKind bailOutKind,LabelInstr *bailOutLabel,
               LabelInstr *skipBailOutLabel)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  BranchInstr *pBVar5;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x16e0,"(instr)","instr");
    if (!bVar2) goto LAB_0066418b;
    *puVar3 = 0;
  }
  if (instr->m_opcode != Neg_I4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x16e1,"(instr->m_opcode == Js::OpCode::Neg_I4)",
                       "instr->m_opcode == Js::OpCode::Neg_I4");
    if (!bVar2) goto LAB_0066418b;
    *puVar3 = 0;
  }
  if ((instr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x16e2,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar2) goto LAB_0066418b;
    *puVar3 = 0;
  }
  if (bailOutKind != BailOutOnFailedHoistedLoopCountBasedBoundCheck &&
      (bailOutKind & BailOutOnResultConditions) == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x16e3,
                       "(bailOutKind & IR::BailOutOnResultConditions || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck)"
                       ,
                       "bailOutKind & IR::BailOutOnResultConditions || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck"
                      );
    if (!bVar2) goto LAB_0066418b;
    *puVar3 = 0;
  }
  if (bailOutLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x16e4,"(bailOutLabel)","bailOutLabel");
    if (!bVar2) goto LAB_0066418b;
    *puVar3 = 0;
  }
  if ((LabelInstr *)instr->m_next != bailOutLabel) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x16e5,"(instr->m_next == bailOutLabel)","instr->m_next == bailOutLabel");
    if (!bVar2) goto LAB_0066418b;
    *puVar3 = 0;
  }
  if (skipBailOutLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x16e6,"(skipBailOutLabel)","skipBailOutLabel");
    if (!bVar2) {
LAB_0066418b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pOVar4 = IR::Opnd::UseWithNewType(instr->m_dst,TyInt32,instr->m_func);
  IR::Instr::ReplaceDst(instr,pOVar4);
  pOVar4 = IR::Opnd::UseWithNewType(instr->m_src1,TyInt32,instr->m_func);
  IR::Instr::ReplaceSrc1(instr,pOVar4);
  instr->m_opcode = NEG;
  Legalize<false>(instr,false);
  if (bailOutKind == BailOutOnFailedHoistedLoopCountBasedBoundCheck || (bailOutKind >> 10 & 1) != 0)
  {
    pBVar5 = IR::BranchInstr::New(JO,bailOutLabel,instr->m_func);
    IR::Instr::InsertBefore(&bailOutLabel->super_Instr,&pBVar5->super_Instr);
  }
  if ((bailOutKind >> 0xc & 1) != 0) {
    pBVar5 = IR::BranchInstr::New(JEQ,bailOutLabel,instr->m_func);
    IR::Instr::InsertBefore(&bailOutLabel->super_Instr,&pBVar5->super_Instr);
  }
  pBVar5 = IR::BranchInstr::New(JMP,skipBailOutLabel,instr->m_func);
  IR::Instr::InsertBefore(&bailOutLabel->super_Instr,&pBVar5->super_Instr);
  return;
}

Assistant:

void
LowererMD::LowerInt4NegWithBailOut(
    IR::Instr *const instr,
    const IR::BailOutKind bailOutKind,
    IR::LabelInstr *const bailOutLabel,
    IR::LabelInstr *const skipBailOutLabel)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::Neg_I4);
    Assert(!instr->HasBailOutInfo());
    Assert(bailOutKind & IR::BailOutOnResultConditions || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);
    Assert(bailOutLabel);
    Assert(instr->m_next == bailOutLabel);
    Assert(skipBailOutLabel);

    instr->ReplaceDst(instr->GetDst()->UseWithNewType(TyInt32, instr->m_func));
    instr->ReplaceSrc1(instr->GetSrc1()->UseWithNewType(TyInt32, instr->m_func));

    // Lower the instruction
    instr->m_opcode = Js::OpCode::NEG;
    Legalize(instr);

    if(bailOutKind & IR::BailOutOnOverflow || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck)
    {
        bailOutLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::JO, bailOutLabel, instr->m_func));
    }

    if(bailOutKind & IR::BailOutOnNegativeZero)
    {
        bailOutLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::JEQ, bailOutLabel, instr->m_func));
    }

    // Skip bailout
    bailOutLabel->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, skipBailOutLabel, instr->m_func));
}